

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O0

void __thiscall
dynet::NaryTreeLSTMBuilder::start_new_sequence_impl
          (NaryTreeLSTMBuilder *this,
          vector<dynet::Expression,_std::allocator<dynet::Expression>_> *hinit)

{
  int iVar1;
  uint uVar2;
  size_type sVar3;
  ostream *poVar4;
  invalid_argument *this_00;
  const_reference pvVar5;
  reference pvVar6;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *in_RSI;
  long in_RDI;
  uint i;
  ostringstream oss;
  size_type in_stack_fffffffffffffe08;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *in_stack_fffffffffffffe10;
  uint local_1c0;
  string local_1b8 [48];
  ostringstream local_188 [376];
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *local_10;
  
  local_10 = in_RSI;
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::clear((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
           *)0xdc2d40);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::clear((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
           *)0xdc2d51);
  sVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::size(local_10);
  if (sVar3 == 0) {
    *(undefined1 *)(in_RDI + 0x160) = 0;
  }
  else {
    iVar1 = *(int *)(in_RDI + 0x198);
    sVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::size(local_10);
    if ((uint)(iVar1 << 1) != sVar3) {
      std::__cxx11::ostringstream::ostringstream(local_188);
      poVar4 = std::operator<<((ostream *)local_188,"Incorrectly sized initialization in TreeLSTM ("
                              );
      sVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::size(local_10);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
      poVar4 = std::operator<<(poVar4,"). Must be twice the number of layers (which is ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(uint *)(in_RDI + 0x198));
      std::operator<<(poVar4,")");
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::invalid_argument::invalid_argument(this_00,local_1b8);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::resize
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::resize
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    for (local_1c0 = 0; local_1c0 < *(uint *)(in_RDI + 0x198); local_1c0 = local_1c0 + 1) {
      pvVar5 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_10,(ulong)local_1c0);
      pvVar6 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                          (in_RDI + 0x180),(ulong)local_1c0);
      pvVar6->pg = pvVar5->pg;
      uVar2 = pvVar5->graph_id;
      pvVar6->i = pvVar5->i;
      pvVar6->graph_id = uVar2;
      pvVar5 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_10,(ulong)(local_1c0 + *(int *)(in_RDI + 0x198)));
      pvVar6 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                          (in_RDI + 0x168),(ulong)local_1c0);
      pvVar6->pg = pvVar5->pg;
      uVar2 = pvVar5->graph_id;
      pvVar6->i = pvVar5->i;
      pvVar6->graph_id = uVar2;
    }
    *(undefined1 *)(in_RDI + 0x160) = 1;
  }
  return;
}

Assistant:

void NaryTreeLSTMBuilder::start_new_sequence_impl(const vector<Expression>& hinit) {
  h.clear();
  c.clear();
  if (hinit.size() > 0) {
    DYNET_ARG_CHECK(layers*2 == hinit.size(),
                            "Incorrectly sized initialization in TreeLSTM (" << hinit.size() << "). "
                            "Must be twice the number of layers (which is " << layers<< ")");
    h0.resize(layers);
    c0.resize(layers);
    for (unsigned i = 0; i < layers; ++i) {
      c0[i] = hinit[i];
      h0[i] = hinit[i + layers];
    }
    has_initial_state = true;
  } else {
    has_initial_state = false;
  }
}